

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

ParsedSchema __thiscall
capnp::SchemaParser::parseDiskFile
          (SchemaParser *this,StringPtr displayName,StringPtr diskPath,
          ArrayPtr<const_kj::StringPtr> importPath)

{
  StringPtr pathText;
  ArrayDisposer *path_00;
  bool bVar1;
  int iVar2;
  Maybe<capnp::SchemaParser::DiskFileCompat> *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  StringPtr *pSVar5;
  pointer ppVar6;
  ArrayPtr<const_kj::StringPtr> *pAVar7;
  size_t end;
  Path *pPVar8;
  StringPtr *params;
  char *__arg;
  pair<const_kj::StringPtr_*,_unsigned_long> pVar9;
  ArrayPtr<const_kj::ReadableDirectory_*const> AVar10;
  ParsedSchema PVar11;
  String local_240;
  Maybe<kj::String> local_228;
  size_t local_208;
  Maybe<kj::String> *pMStack_200;
  Path local_1f8;
  Own<capnp::SchemaFile> local_1e0;
  ArrayPtr<const_kj::String> local_1d0;
  Path local_1c0;
  ImportDir *local_1a8;
  ImportDir *match;
  Fault local_190;
  Fault f;
  _Self local_180;
  iterator iter;
  StringPtr importDir;
  StringPtr *__end2;
  StringPtr *__begin2;
  ArrayPtr<const_kj::StringPtr> *__range2;
  size_t bestMatchLength;
  Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&> matchedImportDir;
  anon_class_24_3_19d59b29 local_128;
  Mapper<kj::ArrayPtr<const_kj::StringPtr>_&> local_110;
  Array<const_kj::ReadableDirectory_*> local_108;
  mapped_type *local_f0;
  mapped_type *slot;
  StringPtr *local_e0;
  undefined1 local_d8 [8];
  pair<const_kj::StringPtr_*,_unsigned_long> importPathKey;
  ArrayPtr<const_kj::ReadableDirectory_*const> translatedImportPath;
  undefined1 local_a8 [8];
  Path path;
  ReadableDirectory *baseDir;
  PathPtr cwd;
  Directory *root;
  DiskFileCompat *c;
  DiskFileCompat *compat;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  SchemaParser *this_local;
  StringPtr diskPath_local;
  StringPtr displayName_local;
  
  __arg = (char *)diskPath.content.size_;
  diskPath_local.content.size_ = (size_t)displayName.content.ptr;
  lock.ptr = (Maybe<capnp::SchemaParser::DiskFileCompat> *)this;
  diskPath_local.content.ptr = __arg;
  kj::Own<capnp::SchemaParser::Impl>::operator->(&this->impl);
  kj::MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)&compat);
  pMVar3 = kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::operator*
                     ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)&compat);
  c = kj::_::readMaybe<capnp::SchemaParser::DiskFileCompat>(pMVar3);
  if (c == (DiskFileCompat *)0x0) {
    pMVar3 = kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::operator->
                       ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)&compat);
    c = kj::Maybe<capnp::SchemaParser::DiskFileCompat>::emplace<>(pMVar3);
  }
  iVar2 = (**c->fs->_vptr_Filesystem)();
  cwd.parts.size_ = CONCAT44(extraout_var,iVar2);
  iVar2 = (*c->fs->_vptr_Filesystem[2])();
  baseDir = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar2);
  path.parts.disposer = (ArrayDisposer *)cwd.parts.size_;
  pathText.content.size_ = (size_t)diskPath_local.content.ptr;
  pathText.content.ptr = diskPath.content.ptr;
  kj::PathPtr::evalNative((Path *)local_a8,(PathPtr *)&baseDir,pathText);
  kj::ArrayPtr<const_kj::ReadableDirectory_*const>::ArrayPtr
            ((ArrayPtr<const_kj::ReadableDirectory_*const> *)&importPathKey.second,(void *)0x0);
  sVar4 = kj::ArrayPtr<const_kj::StringPtr>::size(&importPath);
  if (sVar4 != 0) {
    local_e0 = kj::ArrayPtr<const_kj::StringPtr>::begin(&importPath);
    slot = (mapped_type *)kj::ArrayPtr<const_kj::StringPtr>::size(&importPath);
    pVar9 = std::make_pair<kj::StringPtr_const*,unsigned_long>(&local_e0,(unsigned_long *)&slot);
    importPathKey.first = (StringPtr *)pVar9.second;
    local_d8 = (undefined1  [8])pVar9.first;
    local_f0 = std::
               map<std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>,_std::less<std::pair<const_kj::StringPtr_*,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>_>_>_>
               ::operator[](&c->cachedImportPaths,(key_type *)local_d8);
    bVar1 = kj::Array<const_kj::ReadableDirectory_*>::operator==(local_f0,(void *)0x0);
    if (bVar1) {
      kj::_::Mapper<kj::ArrayPtr<const_kj::StringPtr>_&>::Mapper(&local_110,&importPath);
      local_128.compat = &c;
      local_128.cwd = (PathPtr *)&baseDir;
      local_128.root = (Directory *)cwd.parts.size_;
      kj::_::Mapper<kj::ArrayPtr<const_kj::StringPtr>_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_schema_parser_c__:227:14)>
                (&local_108,&local_110,&local_128);
      kj::Array<const_kj::ReadableDirectory_*>::operator=(local_f0,&local_108);
      kj::Array<const_kj::ReadableDirectory_*>::~Array(&local_108);
    }
    AVar10 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_f0);
    translatedImportPath.ptr = (ReadableDirectory **)AVar10.size_;
    matchedImportDir.ptr = (ImportDir *)AVar10.ptr;
    importPathKey.second = (unsigned_long)matchedImportDir.ptr;
    kj::Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&>::Maybe
              ((Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&> *)&bestMatchLength);
    __range2 = (ArrayPtr<const_kj::StringPtr> *)0x0;
    __end2 = kj::ArrayPtr<const_kj::StringPtr>::begin(&importPath);
    pSVar5 = kj::ArrayPtr<const_kj::StringPtr>::end(&importPath);
    for (; __end2 != pSVar5; __end2 = __end2 + 1) {
      iter._M_node = (_Base_ptr)(__end2->content).ptr;
      local_180._M_node =
           (_Base_ptr)
           std::
           map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
           ::find(&c->cachedImportDirs,(key_type *)&iter);
      f.exception = (Exception *)
                    std::
                    map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                    ::end(&c->cachedImportDirs);
      bVar1 = std::operator!=(&local_180,(_Self *)&f);
      if (!bVar1) {
        kj::_::Debug::Fault::Fault
                  (&local_190,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
                   ,0x104,FAILED,"iter != compat->cachedImportDirs.end()","");
        kj::_::Debug::Fault::fatal(&local_190);
      }
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
               ::operator->(&local_180);
      kj::PathPtr::PathPtr((PathPtr *)&match,&(ppVar6->second).path);
      bVar1 = kj::Path::startsWith((Path *)local_a8,(PathPtr)_match);
      if (bVar1) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                 ::operator->(&local_180);
        pAVar7 = (ArrayPtr<const_kj::StringPtr> *)kj::Path::size(&(ppVar6->second).path);
        if (__range2 < pAVar7) {
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                   ::operator->(&local_180);
          __range2 = (ArrayPtr<const_kj::StringPtr> *)kj::Path::size(&(ppVar6->second).path);
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>
                   ::operator->(&local_180);
          kj::Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&>::operator=
                    ((Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&> *)&bestMatchLength,
                     &ppVar6->second);
        }
      }
    }
    local_1a8 = kj::_::readMaybe<capnp::SchemaParser::DiskFileCompat::ImportDir>
                          ((Maybe<capnp::SchemaParser::DiskFileCompat::ImportDir_&> *)
                           &bestMatchLength);
    if (local_1a8 != (ImportDir *)0x0) {
      path.parts.disposer =
           (ArrayDisposer *)kj::Own::operator_cast_to_ReadableDirectory_((Own *)&local_1a8->dir);
      sVar4 = kj::Path::size(&local_1a8->path);
      end = kj::Path::size((Path *)local_a8);
      local_1d0 = (ArrayPtr<const_kj::String>)kj::Path::slice((Path *)local_a8,sVar4,end);
      kj::PathPtr::clone((PathPtr *)&local_1c0,(__fn *)&local_1d0,(void *)local_1d0.size_,
                         (int)local_1d0.ptr,__arg);
      kj::Path::operator=((Path *)local_a8,&local_1c0);
      kj::Path::~Path(&local_1c0);
    }
  }
  path_00 = path.parts.disposer;
  pPVar8 = kj::mv<kj::Path>((Path *)local_a8);
  kj::Path::Path(&local_1f8,pPVar8);
  local_208 = importPathKey.second;
  pMStack_200 = (Maybe<kj::String> *)translatedImportPath.ptr;
  kj::str<kj::StringPtr&>(&local_240,(kj *)&diskPath_local.content.size_,params);
  kj::Maybe<kj::String>::Maybe(&local_228,&local_240);
  AVar10.size_ = local_208;
  AVar10.ptr = (ReadableDirectory **)&local_1f8;
  SchemaFile::newFromDirectory((ReadableDirectory *)&local_1e0,(Path *)path_00,AVar10,pMStack_200);
  PVar11 = parseFile(this,&local_1e0);
  kj::Own<capnp::SchemaFile>::~Own(&local_1e0);
  kj::Maybe<kj::String>::~Maybe(&local_228);
  kj::String::~String(&local_240);
  kj::Path::~Path(&local_1f8);
  kj::Path::~Path((Path *)local_a8);
  kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::~Locked
            ((Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *)&compat);
  return PVar11;
}

Assistant:

ParsedSchema SchemaParser::parseDiskFile(
    kj::StringPtr displayName, kj::StringPtr diskPath,
    kj::ArrayPtr<const kj::StringPtr> importPath) const {
  auto lock = impl->compat.lockExclusive();
  DiskFileCompat* compat;
  KJ_IF_MAYBE(c, *lock) {
    compat = c;
  } else {
    compat = &lock->emplace();
  }